

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  string *__rhs;
  pointer *pppAVar1;
  uint32_t uVar2;
  pointer pbVar3;
  _Alloc_hider _Var4;
  pointer pcVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  element_type *peVar10;
  pointer ppVar11;
  size_t __n;
  bool bVar12;
  type_conflict tVar13;
  int iVar14;
  App *pAVar15;
  Option *this_00;
  Option *pOVar16;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  int64_t iVar17;
  int *piVar18;
  InvalidError *this_01;
  ConfigError *__return_storage_ptr__;
  ArgumentMismatch *__return_storage_ptr___00;
  ConversionError *__return_storage_ptr___01;
  Classifier num;
  size_type sVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  undefined8 uVar21;
  iterator __begin6;
  pointer *ppbVar22;
  pointer ppVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer;
  undefined1 local_2b8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [32];
  string local_248;
  string local_228;
  string local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  _Any_data local_110;
  _Any_data local_100;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar3 = (item->parents).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
    _Var4._M_p = pbVar3[level]._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,_Var4._M_p,_Var4._M_p + pbVar3[level]._M_string_length);
    pAVar15 = _find_subcommand(this,&local_50,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pAVar15 == (App *)0x0) {
      return false;
    }
    bVar12 = _parse_single_config(pAVar15,item,level + 1);
    return bVar12;
  }
  __rhs = &item->name;
  iVar14 = ::std::__cxx11::string::compare((char *)__rhs);
  if (iVar14 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    increment_parsed(this);
    if (this->pre_parse_called_ == false) {
      this->pre_parse_called_ = true;
      if ((this->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_2b8._0_8_ = (App *)0x2;
        (*(this->pre_parse_callback_)._M_invoker)
                  ((_Any_data *)&this->pre_parse_callback_,(unsigned_long *)local_2b8);
      }
    }
    else if ((this->immediate_callback_ == true) && ((this->name_)._M_string_length != 0)) {
      uVar2 = this->parsed_;
      ppVar6 = (this->missing_).
               super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar7 = (this->missing_).
               super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar8 = (this->missing_).
               super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->missing_).
      super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->missing_).
      super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->missing_).
      super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268._0_8_ = ppVar6;
      local_268._8_8_ = ppVar7;
      local_268._16_8_ = ppVar8;
      clear(this);
      this->parsed_ = uVar2;
      this->pre_parse_called_ = true;
      local_2b8._16_8_ =
           (this->missing_).
           super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->missing_).
      super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar8;
      local_2b8._0_8_ =
           (this->missing_).
           super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2b8._8_8_ =
           (this->missing_).
           super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->missing_).
      super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar6;
      (this->missing_).
      super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = (pointer)0x0;
      local_268._16_8_ = (pointer)0x0;
      std::
      vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2b8);
      std::
      vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_268);
    }
    pAVar15 = this->parent_;
    if (pAVar15 == (App *)0x0) {
      return true;
    }
    __position._M_current =
         (pAVar15->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (pAVar15->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = this;
      pppAVar1 = &(pAVar15->parsed_subcommands_).
                  super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
      return true;
    }
    local_2b8._0_8_ = this;
    ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*>
              ((vector<CLI::App*,std::allocator<CLI::App*>> *)&pAVar15->parsed_subcommands_,
               __position,(App **)local_2b8);
    return true;
  }
  iVar14 = ::std::__cxx11::string::compare((char *)__rhs);
  if (iVar14 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    if ((this->parse_complete_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      return true;
    }
    _process_callbacks(this);
    _process_requirements(this);
    run_callback(this,false,false);
    return true;
  }
  ::std::operator+(&local_70,"--",__rhs);
  this_00 = get_option_no_throw(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (Option *)0x0) {
    sVar19 = (item->name)._M_string_length;
    if (sVar19 == 1) {
      ::std::operator+(&local_90,"-",__rhs);
      this_00 = get_option_no_throw(this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (this_00 != (Option *)0x0) {
        if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          pcVar5 = (item->name)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar5,pcVar5 + (item->name)._M_string_length);
          pOVar16 = get_option_no_throw(this,&local_f0);
          uVar21 = local_f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_0014cb0f;
          goto LAB_0014cb17;
        }
        goto LAB_0014cbe7;
      }
      sVar19 = (item->name)._M_string_length;
    }
    pcVar5 = (__rhs->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar5,pcVar5 + sVar19);
    this_00 = get_option_no_throw(this,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (this_00 == (Option *)0x0) {
      if (this->allow_config_extras_ != capture) {
        return false;
      }
      local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
      ConfigItem::fullname_abi_cxx11_((string *)local_2b8,item);
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,(Classifier *)local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
      if ((App *)local_2b8._0_8_ != (App *)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      pbVar20 = (item->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = (item->inputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar20 == pbVar9) {
        return false;
      }
      do {
        local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&this->missing_,(Classifier *)local_2b8,pbVar20);
        pbVar20 = pbVar20 + 1;
      } while (pbVar20 != pbVar9);
      return false;
    }
  }
  else if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_d0,"-",__rhs);
      pOVar16 = get_option_no_throw(this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((pOVar16 != (Option *)0x0) &&
         ((pOVar16->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_00 = pOVar16;
      }
    }
    if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
      local_110._M_unused._M_object = &local_100;
      pcVar5 = (item->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar5,pcVar5 + (item->name)._M_string_length);
      pOVar16 = get_option_no_throw(this,(string *)&local_110);
      local_f0.field_2._M_allocated_capacity = local_100._M_unused._0_8_;
      uVar21 = local_110._M_unused._0_8_;
      if ((_Any_data *)local_110._M_unused._0_8_ != &local_100) {
LAB_0014cb0f:
        operator_delete((void *)uVar21,(ulong)(local_f0.field_2._M_allocated_capacity + 1));
      }
LAB_0014cb17:
      if ((pOVar16 != (Option *)0x0) &&
         ((pOVar16->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_00 = pOVar16;
      }
    }
  }
LAB_0014cbe7:
  if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
    if (this->allow_config_extras_ == ignore_all) {
      return false;
    }
    __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(&local_130,item);
    ConfigError::NotConfigurable(__return_storage_ptr__,&local_130);
    __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
  }
  if ((this_00->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_00->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  local_288._M_dataplus._M_p = (pointer)0x0;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  if ((item->multiline == true) && (this_00->inject_separator_ == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_288,&item->inputs);
    __first = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_288._M_dataplus._M_p,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_288._M_string_length,(_Iter_equals_val<const_char[3]>)0x16f9c9);
    bVar12 = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_288,(iterator)__first._M_current,(iterator)local_288._M_string_length);
    pbVar20 = &local_288;
  }
  else {
    pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item->inputs;
    bVar12 = false;
  }
  local_288.field_2._8_8_ = &this_00->results_;
  if (this_00->expected_min_ == 0) {
    if ((ulong)((long)(item->inputs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(item->inputs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      peVar10 = (this->config_formatter_).
                super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar10->_vptr_Config[2])(local_2b8,peVar10,item);
      if ((this_00->super_OptionBase<CLI::Option>).disable_flag_override_ == true) {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_2b8._0_8_,
                   (pointer)((long)(Classifier *)local_2b8._8_8_ + local_2b8._0_8_));
        iVar17 = detail::to_flag_value(&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (iVar17 != 1) goto LAB_0014d041;
        local_1e8._M_allocated_capacity = (size_type)&local_1d8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"{}","");
        Option::get_flag_value((string *)local_268,this_00,__rhs,(string *)&local_1e8);
        ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_268);
        if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
        }
        local_208.field_2._M_allocated_capacity = local_1d8._M_allocated_capacity;
        uVar21 = local_1e8._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_allocated_capacity != &local_1d8) {
LAB_0014d0e8:
          operator_delete((void *)uVar21,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_0014d041:
        piVar18 = __errno_location();
        *piVar18 = 0;
        iVar14 = ::std::__cxx11::string::compare(local_2b8);
        if ((iVar14 != 0) || (this_00->expected_max_ < 2)) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,local_2b8._0_8_,
                     (pointer)((long)(Classifier *)local_2b8._8_8_ + local_2b8._0_8_));
          Option::get_flag_value((string *)local_268,this_00,__rhs,&local_208);
          ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_268);
          if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
            operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
          }
          uVar21 = local_208._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_0014d0e8;
        }
      }
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_2b8._0_8_,
                 (pointer)((long)(Classifier *)local_2b8._8_8_ + local_2b8._0_8_));
      Option::_add_result(this_00,&local_228,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_288.field_2._8_8_);
      this_00->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((App *)local_2b8._0_8_ != (App *)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      goto LAB_0014cd84;
    }
    pbVar9 = &local_288;
    if (!bVar12) {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(item->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data;
    }
    ppbVar22 = (pointer *)((long)pbVar9 + 8);
    pbVar3 = *ppbVar22;
    pcVar5 = (pbVar20->_M_dataplus)._M_p;
    local_2b8._0_4_ = this_00->type_size_max_;
    local_290 = pbVar20;
    tVar13 = detail::checked_multiply<int>((int *)local_2b8,this_00->expected_max_);
    iVar14 = 0x20000000;
    if (tVar13) {
      iVar14 = (int)local_2b8._0_8_;
    }
    pbVar20 = local_290;
    if ((iVar14 < (int)((ulong)((long)pbVar3 - (long)pcVar5) >> 5)) &&
       ((this_00->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeAll)) {
      local_2b8._0_4_ = this_00->type_size_max_;
      tVar13 = detail::checked_multiply<int>((int *)local_2b8,this_00->expected_max_);
      if (!tVar13 || 1 < (int)local_2b8._0_4_) {
        __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_170,item);
        local_2b8._0_4_ = this_00->type_size_max_;
        tVar13 = detail::checked_multiply<int>((int *)local_2b8,this_00->expected_max_);
        num = 0x20000000;
        if (tVar13) {
          num = local_2b8._0_4_;
        }
        ArgumentMismatch::AtMost
                  (__return_storage_ptr___00,&local_170,num,
                   (long)*ppbVar22 - (long)(local_290->_M_dataplus)._M_p >> 5);
        __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      if ((this_00->super_OptionBase<CLI::Option>).disable_flag_override_ == false) {
        __return_storage_ptr___01 = (ConversionError *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_190,item);
        ConversionError::TooManyInputsFlag(__return_storage_ptr___01,&local_190);
        __cxa_throw(__return_storage_ptr___01,&ConversionError::typeinfo,Error::~Error);
      }
      pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_290->_M_dataplus)._M_p;
      local_290 = *ppbVar22;
      if (pbVar20 != local_290) {
        do {
          ppVar23 = (this_00->default_flag_values_).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar11 = (this_00->default_flag_values_).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar23 == ppVar11) {
            iVar14 = ::std::__cxx11::string::compare((char *)pbVar20);
            if ((((iVar14 != 0) &&
                 (iVar14 = ::std::__cxx11::string::compare((char *)pbVar20), iVar14 != 0)) &&
                (iVar14 = ::std::__cxx11::string::compare((char *)pbVar20), iVar14 != 0)) &&
               (iVar14 = ::std::__cxx11::string::compare((char *)pbVar20), iVar14 != 0)) {
LAB_0014d172:
              this_01 = (InvalidError *)__cxa_allocate_exception(0x38);
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b0,"invalid flag argument given","");
              InvalidError::InvalidError(this_01,&local_1b0);
              __cxa_throw(this_01,&InvalidError::typeinfo,Error::~Error);
            }
          }
          else {
            __n = pbVar20->_M_string_length;
            while (((ppVar23->second)._M_string_length != __n ||
                   ((__n != 0 &&
                    (iVar14 = bcmp((ppVar23->second)._M_dataplus._M_p,(pbVar20->_M_dataplus)._M_p,
                                   __n), iVar14 != 0))))) {
              ppVar23 = ppVar23 + 1;
              if (ppVar23 == ppVar11) goto LAB_0014d172;
            }
          }
          pcVar5 = (pbVar20->_M_dataplus)._M_p;
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_248,pcVar5,pcVar5 + pbVar20->_M_string_length);
          Option::_add_result(this_00,&local_248,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_288.field_2._8_8_);
          this_00->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._0_8_ + 1);
          }
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != local_290);
      }
      goto LAB_0014cd84;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pbVar20);
  uVar21 = local_288.field_2._8_8_;
  this_00->current_option_state_ = parsing;
  for (; local_1c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_1c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    Option::_add_result(this_00,local_1c8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)uVar21);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  Option::run_callback(this_00);
LAB_0014cd84:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  return true;
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }
    if(op->empty()) {
        std::vector<std::string> buffer;  // a buffer to use for copying an modifying inputs in a few cases
        bool useBuffer{false};
        if(item.multiline) {
            if(!op->get_inject_separator()) {
                buffer = item.inputs;
                buffer.erase(std::remove(buffer.begin(), buffer.end(), "%%"), buffer.end());
                useBuffer = true;
            }
        }
        const std::vector<std::string> &inputs = (useBuffer) ? buffer : item.inputs;
        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(inputs);
        op->run_callback();
    }

    return true;
}